

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

QString * __thiscall
QStringBuilder<const_ProString_&,_const_char_(&)[10]>::convertTo<QString>
          (QString *__return_storage_ptr__,
          QStringBuilder<const_ProString_&,_const_char_(&)[10]> *this)

{
  QChar *__dest;
  ProString *pPVar1;
  char16_t *pcVar2;
  CutResult CVar3;
  char16_t *__src;
  long lVar4;
  long lVar5;
  long in_FS_OFFSET;
  QByteArrayView QVar6;
  iterator d;
  QChar *local_50;
  long local_48;
  long local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar5 = (long)this->a->m_length + 9;
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString(__return_storage_ptr__,lVar5,Uninitialized);
  __dest = (QChar *)(__return_storage_ptr__->d).ptr;
  pPVar1 = this->a;
  lVar4 = (long)pPVar1->m_length;
  local_50 = __dest;
  if (lVar4 != 0) {
    pcVar2 = (pPVar1->m_string).d.ptr;
    local_40 = (long)pPVar1->m_offset;
    local_48 = lVar4;
    CVar3 = QtPrivate::QContainerImplHelper::mid((pPVar1->m_string).d.size,&local_40,&local_48);
    __src = (char16_t *)0x0;
    if (CVar3 != Null) {
      __src = pcVar2 + local_40;
    }
    memcpy(__dest,__src,lVar4 * 2);
    local_50 = local_50 + lVar4;
  }
  QVar6.m_data = *this->b;
  QVar6.m_size = 9;
  QAbstractConcatenable::convertFromUtf8(QVar6,&local_50);
  if (lVar5 != (long)local_50 - (long)__dest >> 1) {
    QString::resize((longlong)__return_storage_ptr__);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }